

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

Vector * Utils::SolveUpperTriangle(Vector *__return_storage_ptr__,Matrix *m,Vector *b)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  int i;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  allocator_type local_51;
  double local_50;
  double local_48;
  ulong local_40;
  Vector *local_38;
  
  local_38 = b;
  uVar3 = Matrix::GetCols(m);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)(int)uVar3,&local_51);
  if (0 < (int)uVar3) {
    local_40 = (ulong)uVar3;
    uVar5 = local_40;
    do {
      uVar1 = uVar5 - 1;
      local_48 = 0.0;
      i = (int)uVar1;
      uVar4 = uVar5;
      if ((long)uVar5 < (long)local_40) {
        do {
          local_50 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar4];
          dVar6 = Matrix::operator()(m,i,(int)uVar4);
          local_48 = local_48 + local_50 * dVar6;
          uVar4 = uVar4 + 1;
        } while ((int)uVar4 < (int)uVar3);
      }
      local_50 = (local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar1];
      dVar6 = Matrix::operator()(m,i,i);
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar1] = (local_50 - local_48) / dVar6;
      bVar2 = 1 < (long)uVar5;
      uVar5 = uVar1;
    } while (bVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector Utils::SolveUpperTriangle(const Matrix& m, const Vector& b)
{
    const int n = m.GetCols();
    Vector x(n);

    for (int i = n - 1; i >= 0; --i)
    {
        double sum = 0;
        for (int j = i + 1; j < n; ++j)
        {
            sum += x[j] * m(i, j);
        }
        x[i] = (b[i] - sum) / m(i, i);
    }

    return x;
}